

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

uint32_t ngx_utf8_decode(u_char **p,size_t n)

{
  byte *pbVar1;
  uint uVar2;
  uint local_34;
  uint32_t valid;
  uint32_t i;
  uint32_t u;
  size_t len;
  size_t n_local;
  u_char **p_local;
  
  uVar2 = (uint)**p;
  if (uVar2 < 0xf0) {
    if (uVar2 < 0xe0) {
      if (uVar2 < 0xc2) {
        *p = *p + 1;
        return 0xffffffff;
      }
      valid = uVar2 & 0x1f;
      local_34 = 0x7f;
      _i = 1;
    }
    else {
      valid = uVar2 & 0xf;
      local_34 = 0x7ff;
      _i = 2;
    }
  }
  else {
    valid = uVar2 & 7;
    local_34 = 0xffff;
    _i = 3;
  }
  if (n - 1 < _i) {
    p_local._4_4_ = 0xfffffffe;
  }
  else {
    *p = *p + 1;
    for (; _i != 0; _i = _i - 1) {
      pbVar1 = *p;
      *p = pbVar1 + 1;
      uVar2 = (uint)*pbVar1;
      if (uVar2 < 0x80) {
        return 0xffffffff;
      }
      valid = valid << 6 | uVar2 & 0x3f;
    }
    if (local_34 < valid) {
      p_local._4_4_ = valid;
    }
    else {
      p_local._4_4_ = 0xffffffff;
    }
  }
  return p_local._4_4_;
}

Assistant:

uint32_t
ngx_utf8_decode(u_char **p, size_t n)
{
    size_t    len;
    uint32_t  u, i, valid;

    u = **p;

    if (u >= 0xf0) {

        u &= 0x07;
        valid = 0xffff;
        len = 3;

    } else if (u >= 0xe0) {

        u &= 0x0f;
        valid = 0x7ff;
        len = 2;

    } else if (u >= 0xc2) {

        u &= 0x1f;
        valid = 0x7f;
        len = 1;

    } else {
        (*p)++;
        return 0xffffffff;
    }

    if (n - 1 < len) {
        return 0xfffffffe;
    }

    (*p)++;

    while (len) {
        i = *(*p)++;

        if (i < 0x80) {
            return 0xffffffff;
        }

        u = (u << 6) | (i & 0x3f);

        len--;
    }

    if (u > valid) {
        return u;
    }

    return 0xffffffff;
}